

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O1

iterator_range<llvm::DWARFDie::attribute_iterator> * __thiscall
llvm::DWARFDie::attributes
          (iterator_range<llvm::DWARFDie::attribute_iterator> *__return_storage_ptr__,DWARFDie *this
          )

{
  long lVar1;
  attribute_iterator *paVar2;
  iterator_range<llvm::DWARFDie::attribute_iterator> *piVar3;
  byte bVar4;
  attribute_iterator local_78;
  
  bVar4 = 0;
  attribute_iterator::attribute_iterator(&local_78,*this,false);
  attribute_iterator::attribute_iterator(&__return_storage_ptr__->end_iterator,*this,true);
  paVar2 = &local_78;
  piVar3 = __return_storage_ptr__;
  for (lVar1 = 0xb; lVar1 != 0; lVar1 = lVar1 + -1) {
    (piVar3->begin_iterator).Die.U = (paVar2->Die).U;
    paVar2 = (attribute_iterator *)((long)paVar2 + (ulong)bVar4 * -0x10 + 8);
    piVar3 = (iterator_range<llvm::DWARFDie::attribute_iterator> *)
             ((long)piVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

iterator_range<DWARFDie::attribute_iterator> DWARFDie::attributes() const {
  return make_range(attribute_iterator(*this, false),
                    attribute_iterator(*this, true));
}